

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

ssize_t __thiscall FileManager::write(FileManager *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  bVar2 = checkActiveFile(this);
  if (bVar2) {
    iVar3 = (*((this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_AssemblerFile[4])();
    if ((char)iVar3 != '\0') {
      peVar1 = (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar1->_vptr_AssemblerFile[5])(peVar1,CONCAT44(in_register_00000034,__fd),__buf);
      return CONCAT44(extraout_var,iVar3);
    }
    Logger::queueError<>(Error,"No file opened");
  }
  return 0;
}

Assistant:

bool FileManager::write(void* data, size_t length)
{
	if (!checkActiveFile())
		return false;

	if (!activeFile->isOpen())
	{
		Logger::queueError(Logger::Error, "No file opened");
		return false;
	}

	return activeFile->write(data,length);
}